

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall RegisterRequest::RegisterRequest(RegisterRequest *this,Event *e)

{
  bool bVar1;
  reference pvVar2;
  EventNotValid *this_00;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  allocator local_12d;
  allocator local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  string *local_128;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [64];
  string local_50;
  
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  (this->password)._M_dataplus._M_p = (pointer)&(this->password).field_2;
  (this->password)._M_string_length = 0;
  local_128 = (string *)&this->password;
  (this->password).field_2._M_local_buf[0] = '\0';
  (this->alias)._M_dataplus._M_p = (pointer)&(this->alias).field_2;
  (this->alias)._M_string_length = 0;
  (this->alias).field_2._M_local_buf[0] = '\0';
  (this->bio)._M_dataplus._M_p = (pointer)&(this->bio).field_2;
  (this->bio)._M_string_length = 0;
  (this->bio).field_2._M_local_buf[0] = '\0';
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_120,e);
  std::__cxx11::string::string((string *)&local_110,"type",&local_129);
  std::__cxx11::string::string(local_f0,"username",&local_12a);
  std::__cxx11::string::string(local_d0,"password",&local_12b);
  std::__cxx11::string::string(local_b0,"alias",&local_12c);
  std::__cxx11::string::string(local_90,"bio",&local_12d);
  keysToBeInEvent._M_len = 5;
  keysToBeInEvent._M_array = &local_110;
  bVar1 = checkEventKeys(&local_120,keysToBeInEvent);
  lVar3 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_110._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_120);
  if (bVar1) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)e,"username");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_110,pvVar2);
    std::__cxx11::string::operator=((string *)this,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)e,"password");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_110,pvVar2);
    std::__cxx11::string::operator=(local_128,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)e,"alias");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_110,pvVar2);
    std::__cxx11::string::operator=((string *)&this->alias,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)e,"bio");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_110,pvVar2);
    std::__cxx11::string::operator=((string *)&this->bio,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    return;
  }
  this_00 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_50,"Improper REGISTER_REQUEST",(allocator *)&local_110);
  EventNotValid::EventNotValid(this_00,&local_50);
  __cxa_throw(this_00,&EventNotValid::typeinfo,EventError::~EventError);
}

Assistant:

explicit RegisterRequest(Event e){
	  if(!checkEventKeys(e, {"type", "username", "password", "alias", "bio"})) {
		  throw EventNotValid("Improper REGISTER_REQUEST");
	  }
	  try{
		  username = e["username"].get<std::string>();
		  password = e["password"].get<std::string>();
		  alias = e["alias"].get<std::string>();
		  bio = e["bio"].get<std::string>();
	  }
	  catch(...){
		  throw EventNotValid("Improper REGISTER_REQUEST");
	  }
  }